

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::App::remove_needs(App *this,App *app)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_const_iterator<CLI::App_*> __position;
  
  p_Var1 = &(this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header;
  __position = ::std::
               __find_if<std::_Rb_tree_const_iterator<CLI::App*>,__gnu_cxx::__ops::_Iter_equals_val<CLI::App*const>>
                         ((this->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_left,p_Var1);
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    ::std::
    _Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
    ::erase_abi_cxx11_((_Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
                        *)&this->need_subcommands_,(const_iterator)__position._M_node);
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

CLI11_INLINE bool App::remove_needs(App *app) {
    auto iterator = std::find(std::begin(need_subcommands_), std::end(need_subcommands_), app);
    if(iterator == std::end(need_subcommands_)) {
        return false;
    }
    need_subcommands_.erase(iterator);
    return true;
}